

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef
ConvertToDataType(LlvmCompilationContext *ctx,LLVMValueRef value,TypeBase *valueType,
                 TypeBase *targetType)

{
  LLVMBuilderRef pLVar1;
  LLVMTypeRef pLVar2;
  LLVMValueRef pLVar3;
  TypeBase *targetType_local;
  TypeBase *valueType_local;
  LLVMValueRef value_local;
  LlvmCompilationContext *ctx_local;
  
  if (targetType == valueType) {
    return value;
  }
  if (valueType == ctx->ctx->typeInt) {
    if (targetType == ctx->ctx->typeBool) {
      pLVar1 = ctx->builder;
      pLVar2 = CompileLlvmType(ctx,targetType);
      pLVar3 = LLVMBuildTrunc(pLVar1,value,pLVar2,"");
      return pLVar3;
    }
    if (targetType == ctx->ctx->typeChar) {
      pLVar1 = ctx->builder;
      pLVar2 = CompileLlvmType(ctx,targetType);
      pLVar3 = LLVMBuildTrunc(pLVar1,value,pLVar2,"");
      return pLVar3;
    }
    if (targetType == ctx->ctx->typeShort) {
      pLVar1 = ctx->builder;
      pLVar2 = CompileLlvmType(ctx,targetType);
      pLVar3 = LLVMBuildTrunc(pLVar1,value,pLVar2,"");
      return pLVar3;
    }
  }
  ctx_local = (LlvmCompilationContext *)value;
  if ((valueType == ctx->ctx->typeDouble) && (targetType == ctx->ctx->typeFloat)) {
    pLVar1 = ctx->builder;
    pLVar2 = CompileLlvmType(ctx,targetType);
    ctx_local = (LlvmCompilationContext *)LLVMBuildFPCast(pLVar1,value,pLVar2,"");
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef ConvertToDataType(LlvmCompilationContext &ctx, LLVMValueRef value, TypeBase *valueType, TypeBase *targetType)
{
	if(targetType == valueType)
		return value;

	if(valueType == ctx.ctx.typeInt)
	{
		if(targetType == ctx.ctx.typeBool)
			return LLVMBuildTrunc(ctx.builder, value, CompileLlvmType(ctx, targetType), "");

		if(targetType == ctx.ctx.typeChar)
			return LLVMBuildTrunc(ctx.builder, value, CompileLlvmType(ctx, targetType), "");

		if(targetType == ctx.ctx.typeShort)
			return LLVMBuildTrunc(ctx.builder, value, CompileLlvmType(ctx, targetType), "");
	}

	if(valueType == ctx.ctx.typeDouble)
	{
		if(targetType == ctx.ctx.typeFloat)
			return LLVMBuildFPCast(ctx.builder, value, CompileLlvmType(ctx, targetType), "");
	}

	return value;
}